

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTree.cpp
# Opt level: O3

void __thiscall Indexing::CodeTree::ILStruct::ensureFreshness(ILStruct *this,uint globalTimestamp)

{
  if (this->timestamp != globalTimestamp) {
    this->timestamp = globalTimestamp;
    this->matchCnt = 0;
    *(undefined4 *)((long)&this->matchCnt + 3) = 0;
  }
  return;
}

Assistant:

void CodeTree::ILStruct::ensureFreshness(unsigned globalTimestamp)
{
  if(timestamp!=globalTimestamp) {
    timestamp=globalTimestamp;
    visited=false;
    finished=false;
    noNonOppositeMatches=false;
    matchCnt=0;
  }
}